

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
CreateHeapBlock(HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                *this,Recycler *recycler)

{
  uint32 *puVar1;
  HeapInfo *pHVar2;
  BOOL BVar3;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  
  heapBlock = GetUnusedHeapBlock(this);
  if (heapBlock != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    BVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ReassignPages
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock,recycler);
    if (BVar3 != 0) {
      pHVar2 = (this->super_HeapBucket).heapInfo;
      (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next =
           (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
           pHVar2->newMediumFinalizableHeapBlockList;
      pHVar2->newMediumFinalizableHeapBlockList = heapBlock;
      LOCK();
      puVar1 = &(this->super_HeapBucket).newHeapBlockCount;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
      return heapBlock;
    }
    FreeHeapBlock(this,heapBlock);
  }
  return (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
}

Assistant:

TBlockType *
HeapBucketT<TBlockType>::CreateHeapBlock(Recycler * recycler)
{
    FAULTINJECT_MEMORY_NOTHROW(_u("HeapBlock"), sizeof(TBlockType));

    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return nullptr;
    }

    if (!heapBlock->ReassignPages(recycler))
    {
        FreeHeapBlock(heapBlock);
        return nullptr;
    }

    // Add it to head of heap block list so we will keep track of the block
    this->heapInfo->AppendNewHeapBlock(heapBlock, this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if ENABLE_CONCURRENT_GC
    ::InterlockedIncrement(&this->newHeapBlockCount);
#else
    this->heapBlockCount++;
#endif
#endif
    return heapBlock;
}